

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool __thiscall
QHttpHeaders::replace(QHttpHeaders *this,qsizetype i,QAnyStringView name,QAnyStringView newValue)

{
  long lVar1;
  QAnyStringView value;
  QAnyStringView value_00;
  QAnyStringView name_00;
  QAnyStringView name_01;
  bool bVar2;
  QHttpHeadersPrivate *pQVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  QList<Header> *in_RDI;
  long in_FS_OFFSET;
  HeaderName *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  rvalue_ref t;
  QList<Header> *pQVar4;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x1;
  name_01.m_size = (size_t)in_RDI;
  name_01.field_0.m_data = in_RSI.m_data;
  pQVar4 = in_RDI;
  aVar6 = in_RSI;
  bVar2 = isValidHttpHeaderNameField(name_01);
  if ((bVar2) &&
     (value.m_size = (size_t)pQVar4, value.field_0.m_data = in_RSI.m_data,
     bVar2 = isValidHttpHeaderValueField(value), bVar2)) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    pQVar3 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c7214);
    t = (rvalue_ref)&pQVar3->headers;
    name_00.m_size = (size_t)aVar6.m_data;
    name_00.field_0.m_data = aVar5.m_data;
    HeaderName::HeaderName(in_stack_ffffffffffffff08,name_00);
    value_00.field_0._7_1_ = in_stack_ffffffffffffff47;
    value_00.field_0._0_7_ = in_stack_ffffffffffffff40;
    value_00.m_size = (size_t)aVar5.m_data;
    normalizedValue(value_00);
    QList<Header>::replace(in_RDI,(qsizetype)in_RSI,t);
    Header::~Header((Header *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHttpHeaders::replace(qsizetype i, QAnyStringView name, QAnyStringView newValue)
{
    verify(i);
    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    d.detach();
    d->headers.replace(i, {HeaderName{name}, normalizedValue(newValue)});
    return true;
}